

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemView::horizontalScrollbarValueChanged(QAbstractItemView *this,int value)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  QWidgetData *pQVar2;
  long *plVar3;
  char cVar4;
  int iVar5;
  QScrollBar *this_01;
  QWidget *pQVar6;
  long in_FS_OFFSET;
  QPoint local_60;
  QModelIndex local_58;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  this_01 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
  iVar5 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
  if (iVar5 == value) {
    pQVar1 = this_00->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&this_00->root);
    cVar4 = (**(code **)(*(long *)pQVar1 + 0x130))(pQVar1,&local_58);
    if (cVar4 != '\0') {
      pQVar1 = this_00->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&this_00->root);
      (**(code **)(*(long *)pQVar1 + 0x128))(pQVar1,&local_58);
    }
  }
  pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  local_58._0_8_ = QCursor::pos();
  local_60 = QWidget::mapFromGlobal(pQVar6,(QPoint *)&local_58);
  pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  pQVar2 = pQVar6->data;
  local_58.i = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                        (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
  local_58.r = 0;
  local_58.c = 0;
  cVar4 = QRect::contains((QPoint *)&local_58,SUB81(&local_60,0));
  if (cVar4 != '\0') {
    plVar3 = *(long **)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                        super_QWidgetPrivate.field_0x8;
    (**(code **)(*plVar3 + 0x1f0))(&local_58,plVar3,&local_60);
    QPersistentModelIndex::QPersistentModelIndex(&local_40,&local_58);
    QAbstractItemViewPrivate::checkMouseMove(this_00,&local_40);
    QPersistentModelIndex::~QPersistentModelIndex(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::horizontalScrollbarValueChanged(int value)
{
    Q_D(QAbstractItemView);
    if (horizontalScrollBar()->maximum() == value && d->model->canFetchMore(d->root))
        d->model->fetchMore(d->root);
    QPoint posInVp = viewport()->mapFromGlobal(QCursor::pos());
    if (viewport()->rect().contains(posInVp))
        d->checkMouseMove(posInVp);
}